

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O2

StateStatus __thiscall SimpleServer::HttpParser::removeLeadingSpaces(HttpParser *this)

{
  string *this_00;
  StateStatus SVar1;
  size_t sVar2;
  string asStack_38 [32];
  
  this_00 = &this->request;
  sVar2 = std::__cxx11::string::find_last_of((char *)this_00,0x108845);
  this->pos = sVar2;
  if (sVar2 == 0xffffffffffffffff) {
    SVar1 = FAIL;
  }
  else {
    if (sVar2 == (this->request)._M_string_length - 1) {
      return READING;
    }
    std::__cxx11::string::substr((ulong)asStack_38,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,asStack_38);
    std::__cxx11::string::~string(asStack_38);
    SVar1 = OK;
  }
  this->pos = 0;
  return SVar1;
}

Assistant:

StateStatus removeLeadingSpaces()
		{
			pos = request.find_last_of(SPACES, pos);

			if (pos != std::string::npos)
			{
				if (pos == request.size() - 1)
					return READING;

				request = request.substr(pos + 1);
				pos = 0;

				return OK;
			}
			else
			{
				pos = 0;
				return FAIL;
			}
		}